

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::adjustForCapitalizationContext
          (RuleBasedNumberFormat *this,int32_t startPos,UnicodeString *currentResult,
          UErrorCode *status)

{
  char cVar1;
  short sVar2;
  UBool UVar3;
  int iVar4;
  int iVar5;
  UChar32 c;
  
  iVar4 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x21])
                    (this,1,status);
  if (startPos == 0 && iVar4 != 0x100) {
    sVar2 = (currentResult->fUnion).fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar5 = (currentResult->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar2 >> 5;
    }
    if (0 < iVar5) {
      c = UnicodeString::char32At(currentResult,0);
      UVar3 = u_islower_63(c);
      if (((UVar3 != '\0') && (*status < U_ILLEGAL_ARGUMENT_ERROR)) &&
         (this->capitalizationBrkIter != (BreakIterator *)0x0)) {
        if (iVar4 != 0x102) {
          if (iVar4 == 0x104) {
            cVar1 = this->capitalizationForStandAlone;
          }
          else {
            if (iVar4 != 0x103) {
              return currentResult;
            }
            cVar1 = this->capitalizationForUIListMenu;
          }
          if (cVar1 == '\0') {
            return currentResult;
          }
        }
        UnicodeString::toTitle(currentResult,this->capitalizationBrkIter,&this->locale,0x300);
      }
    }
  }
  return currentResult;
}

Assistant:

UnicodeString&
RuleBasedNumberFormat::adjustForCapitalizationContext(int32_t startPos,
                                                      UnicodeString& currentResult,
                                                      UErrorCode& status) const
{
#if !UCONFIG_NO_BREAK_ITERATION
    UDisplayContext capitalizationContext = getContext(UDISPCTX_TYPE_CAPITALIZATION, status);
    if (capitalizationContext != UDISPCTX_CAPITALIZATION_NONE && startPos == 0 && currentResult.length() > 0) {
        // capitalize currentResult according to context
        UChar32 ch = currentResult.char32At(0);
        if (u_islower(ch) && U_SUCCESS(status) && capitalizationBrkIter != NULL &&
              ( capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE ||
                (capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU && capitalizationForUIListMenu) ||
                (capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_STANDALONE && capitalizationForStandAlone)) ) {
            // titlecase first word of currentResult, here use sentence iterator unlike current implementations
            // in LocaleDisplayNamesImpl::adjustForUsageAndContext and RelativeDateFormat::format
            currentResult.toTitle(capitalizationBrkIter, locale, U_TITLECASE_NO_LOWERCASE | U_TITLECASE_NO_BREAK_ADJUSTMENT);
        }
    }
#endif
    return currentResult;
}